

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS
ref_agents_pop(REF_AGENTS ref_agents,REF_INT *node,REF_INT *part,REF_INT *seed,REF_DBL *xyz)

{
  int id_00;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT id;
  REF_INT i;
  REF_DBL *xyz_local;
  REF_INT *seed_local;
  REF_INT *part_local;
  REF_INT *node_local;
  REF_AGENTS ref_agents_local;
  
  if (ref_agents->last == -1) {
    ref_agents_local._4_4_ = 5;
  }
  else {
    id_00 = ref_agents->last;
    *node = ref_agents->agent[id_00].node;
    *part = ref_agents->agent[id_00].part;
    *seed = ref_agents->agent[id_00].seed;
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      xyz[ref_private_macro_code_rss] = ref_agents->agent[id_00].xyz[ref_private_macro_code_rss];
    }
    ref_agents_local._4_4_ = ref_agents_remove(ref_agents,id_00);
    if (ref_agents_local._4_4_ == 0) {
      ref_agents_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0xdc
             ,"ref_agents_pop",(ulong)ref_agents_local._4_4_,"rm");
    }
  }
  return ref_agents_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_agents_pop(REF_AGENTS ref_agents, REF_INT *node,
                                  REF_INT *part, REF_INT *seed, REF_DBL *xyz) {
  REF_INT i, id;

  if (REF_EMPTY == ref_agents->last) return REF_NOT_FOUND;

  id = ref_agents->last;

  *node = ref_agent_node(ref_agents, id);
  *part = ref_agent_part(ref_agents, id);
  *seed = ref_agent_seed(ref_agents, id);
  for (i = 0; i < 3; i++) xyz[i] = ref_agent_xyz(ref_agents, i, id);

  RSS(ref_agents_remove(ref_agents, id), "rm");

  return REF_SUCCESS;
}